

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrdb.cpp
# Opt level: O0

void (anonymous_namespace)::DeserializeDB<AutoFile,AddrMan&>
               (AutoFile *stream,AddrMan *data,bool fCheckSum)

{
  long lVar1;
  bool bVar2;
  runtime_error *prVar3;
  byte in_DL;
  long in_FS_OFFSET;
  MessageStartChars pchMsgTmp;
  uint256 hashTmp;
  HashVerifier<AutoFile> verifier;
  CChainParams *in_stack_fffffffffffffef8;
  AutoFile *in_stack_ffffffffffffff00;
  HashVerifier<AutoFile> *in_stack_ffffffffffffff08;
  array<unsigned_char,_4UL> *in_stack_ffffffffffffff10;
  HashWriter *in_stack_ffffffffffffff18;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  HashVerifier<AutoFile>::HashVerifier(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  HashVerifier<AutoFile>::operator>>
            (in_stack_ffffffffffffff08,(array<unsigned_char,_4UL> *)in_stack_ffffffffffffff00);
  Params();
  CChainParams::MessageStart(in_stack_fffffffffffffef8);
  bVar2 = std::operator==((array<unsigned_char,_4UL> *)in_stack_ffffffffffffff18,
                          in_stack_ffffffffffffff10);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    HashVerifier<AutoFile>::operator>>
              (in_stack_ffffffffffffff08,(AddrMan *)in_stack_ffffffffffffff00);
    if ((in_DL & 1) != 0) {
      uint256::uint256((uint256 *)in_stack_fffffffffffffef8);
      AutoFile::operator>>
                ((AutoFile *)in_stack_ffffffffffffff08,(uint256 *)in_stack_ffffffffffffff00);
      HashWriter::GetHash(in_stack_ffffffffffffff18);
      bVar2 = ::operator!=((base_blob<256U> *)in_stack_ffffffffffffff08,
                           (base_blob<256U> *)in_stack_ffffffffffffff00);
      if (bVar2) {
        prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar3,"Checksum mismatch, data corrupted");
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        goto LAB_00872d50;
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
  }
  else {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar3,"Invalid network magic number");
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
LAB_00872d50:
  __stack_chk_fail();
}

Assistant:

void DeserializeDB(Stream& stream, Data&& data, bool fCheckSum = true)
{
    HashVerifier verifier{stream};
    // de-serialize file header (network specific magic number) and ..
    MessageStartChars pchMsgTmp;
    verifier >> pchMsgTmp;
    // ... verify the network matches ours
    if (pchMsgTmp != Params().MessageStart()) {
        throw std::runtime_error{"Invalid network magic number"};
    }

    // de-serialize data
    verifier >> data;

    // verify checksum
    if (fCheckSum) {
        uint256 hashTmp;
        stream >> hashTmp;
        if (hashTmp != verifier.GetHash()) {
            throw std::runtime_error{"Checksum mismatch, data corrupted"};
        }
    }
}